

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

bool __thiscall
duckdb::BitpackingState<long,_long>::Flush<duckdb::EmptyBitpackingWriter>
          (BitpackingState<long,_long> *this)

{
  byte width_00;
  byte bVar1;
  bitpacking_width_t width_01;
  unsigned_long uVar2;
  idx_t iVar3;
  BitpackingState<long,_long> *in_RDI;
  BitpackingState<long,_long> *in_stack_00000010;
  bitpacking_width_t width;
  bitpacking_width_t regular_required_bitwidth;
  bitpacking_width_t delta_required_bitwidth;
  long frame_of_reference;
  undefined8 in_stack_ffffffffffffffc8;
  bitpacking_width_t bVar4;
  BitpackingState<long,_long> *in_stack_ffffffffffffffd0;
  void *data_ptr;
  bool local_1;
  
  bVar4 = (bitpacking_width_t)((ulong)in_stack_ffffffffffffffc8 >> 0x38);
  if (in_RDI->compression_buffer_idx == 0) {
    local_1 = true;
  }
  else if ((((in_RDI->all_invalid & 1U) == 0) && (in_RDI->maximum != in_RDI->minimum)) ||
          ((in_RDI->mode != AUTO && (in_RDI->mode != CONSTANT)))) {
    CalculateFORStats(in_stack_ffffffffffffffd0);
    CalculateDeltaStats(in_stack_00000010);
    if ((in_RDI->can_do_delta & 1U) != 0) {
      if (((in_RDI->maximum_delta == in_RDI->minimum_delta) && (in_RDI->mode != FOR)) &&
         (in_RDI->mode != DELTA_FOR)) {
        EmptyBitpackingWriter::WriteConstantDelta<long,long>
                  (in_RDI->maximum_delta,*in_RDI->compression_buffer,in_RDI->compression_buffer_idx,
                   in_RDI->compression_buffer,in_RDI->compression_buffer_validity,in_RDI->data_ptr);
        in_RDI->total_size = in_RDI->total_size + 0x14;
        return true;
      }
      width_00 = BitpackingPrimitives::MinimumBitWidth<long,false>(0xa84bd2);
      bVar1 = BitpackingPrimitives::MinimumBitWidth<long,true>(0xa84be9);
      if ((width_00 < bVar1) && (in_RDI->mode != FOR)) {
        SubtractFrameOfReference<long>(in_RDI,in_RDI->delta_buffer,in_RDI->minimum_delta);
        iVar3 = in_RDI->compression_buffer_idx;
        data_ptr = in_RDI->data_ptr;
        EmptyBitpackingWriter::WriteDeltaFor<long,long>
                  (in_RDI->delta_buffer,in_RDI->compression_buffer_validity,width_00,
                   in_RDI->minimum_delta,in_RDI->delta_offset,in_RDI->compression_buffer,iVar3,
                   data_ptr);
        bVar4 = (bitpacking_width_t)(iVar3 >> 0x38);
        in_RDI->total_size = in_RDI->total_size + 8;
        uVar2 = AlignValue<unsigned_long,_8UL>(1);
        in_RDI->total_size = uVar2 + in_RDI->total_size;
        in_RDI->total_size = in_RDI->total_size + 8;
        iVar3 = BitpackingPrimitives::GetRequiredSize((idx_t)data_ptr,bVar4);
        in_RDI->total_size = iVar3 + in_RDI->total_size;
        return true;
      }
    }
    if ((in_RDI->can_do_for & 1U) == 0) {
      local_1 = false;
    }
    else {
      width_01 = BitpackingPrimitives::MinimumBitWidth<long,false>(0xa84d1c);
      SubtractFrameOfReference<long>(in_RDI,in_RDI->compression_buffer,in_RDI->minimum);
      EmptyBitpackingWriter::WriteFor<long>
                (in_RDI->compression_buffer,in_RDI->compression_buffer_validity,width_01,
                 in_RDI->minimum,in_RDI->compression_buffer_idx,in_RDI->data_ptr);
      iVar3 = BitpackingPrimitives::GetRequiredSize((idx_t)in_stack_ffffffffffffffd0,bVar4);
      in_RDI->total_size = iVar3 + in_RDI->total_size;
      in_RDI->total_size = in_RDI->total_size + 8;
      uVar2 = AlignValue<unsigned_long,_8UL>(1);
      in_RDI->total_size = uVar2 + in_RDI->total_size;
      local_1 = true;
    }
  }
  else {
    EmptyBitpackingWriter::WriteConstant<long>
              (in_RDI->maximum,in_RDI->compression_buffer_idx,in_RDI->data_ptr,
               (bool)(in_RDI->all_invalid & 1));
    in_RDI->total_size = in_RDI->total_size + 0xc;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}